

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

fdb_status btreeblk_end(btreeblk_handle *handle)

{
  fdb_status fVar1;
  list_elem *plVar2;
  list_elem *e;
  
  fVar1 = btreeblk_operation_end(handle);
  if ((fVar1 == FDB_RESULT_SUCCESS) && (e = (handle->alc_list).head, e != (list_elem *)0x0)) {
    do {
      plVar2 = list_remove(&handle->alc_list,e);
      *(undefined1 *)&e[-1].prev = 0;
      list_push_front(&handle->read_list,e);
      e = plVar2;
    } while (plVar2 != (list_elem *)0x0);
  }
  return fVar1;
}

Assistant:

fdb_status btreeblk_end(struct btreeblk_handle *handle)
{
    struct list_elem *e;
    struct btreeblk_block *block;
    fdb_status status = FDB_RESULT_SUCCESS;

    // flush all dirty items
    status = btreeblk_operation_end((void *)handle);
    if (status != FDB_RESULT_SUCCESS) {
        return status;
    }

    // remove all items in lists
    e = list_begin(&handle->alc_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->alc_list, &block->le);

        block->dirty = 0;
        list_push_front(&handle->read_list, &block->le);
    }
    return status;
}